

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

void Abc_WriteComp(FILE *pFile)

{
  fwrite(".model Comp\n",0xc,1,(FILE *)pFile);
  fwrite(".inputs a b\n",0xc,1,(FILE *)pFile);
  fwrite(".outputs x y\n",0xd,1,(FILE *)pFile);
  fwrite(".names a b x\n",0xd,1,(FILE *)pFile);
  fwrite("11 1\n",5,1,(FILE *)pFile);
  fwrite(".names a b y\n",0xd,1,(FILE *)pFile);
  fwrite("1- 1\n",5,1,(FILE *)pFile);
  fwrite("-1 1\n",5,1,(FILE *)pFile);
  fwrite(".end\n",5,1,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Abc_WriteComp( FILE * pFile )
{
    fprintf( pFile, ".model Comp\n" );
    fprintf( pFile, ".inputs a b\n" ); 
    fprintf( pFile, ".outputs x y\n" ); 
    fprintf( pFile, ".names a b x\n" ); 
    fprintf( pFile, "11 1\n" ); 
    fprintf( pFile, ".names a b y\n" ); 
    fprintf( pFile, "1- 1\n" ); 
    fprintf( pFile, "-1 1\n" ); 
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
}